

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_pcmpistri_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  uint uVar1;
  int valids;
  int validd;
  uint uVar2;
  uint uVar3;
  byte ctrl_00;
  
  ctrl_00 = (byte)ctrl;
  valids = pcmp_ilen(s,ctrl_00);
  validd = pcmp_ilen(d,ctrl_00);
  uVar2 = pcmpxstrx(env,d,s,ctrl_00,valids,validd);
  if (uVar2 == 0) {
    uVar3 = 0x10 >> (ctrl_00 & 1);
  }
  else {
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar3 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    if ((ctrl & 0x40) != 0) {
      uVar3 = uVar1;
    }
  }
  env->regs[1] = (ulong)uVar3;
  return;
}

Assistant:

void glue(helper_pcmpistri, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    unsigned int res = pcmpxstrx(env, d, s, ctrl,
                                 pcmp_ilen(s, ctrl),
                                 pcmp_ilen(d, ctrl));

    if (res) {
        env->regs[R_ECX] = (ctrl & (1 << 6)) ? 31 - clz32(res) : ctz32(res);
    } else {
        env->regs[R_ECX] = 16 >> (ctrl & (1 << 0));
    }
}